

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

void __thiscall CVmObjFile::load_image_data(CVmObjFile *this,char *ptr,size_t siz)

{
  long in_RSI;
  undefined8 in_RDI;
  unsigned_long unaff_retaddr;
  CVmDataSource *in_stack_00000008;
  vm_obj_id_t in_stack_00000014;
  unsigned_long flags;
  CVmObjFile *in_stack_00000020;
  int access;
  int mode;
  vm_obj_id_t charset;
  int mode_00;
  
  mode_00 = (int)((ulong)in_RDI >> 0x20);
  vmb_get_objid((char *)0x2e34a7);
  ::osrp4((void *)(in_RSI + 6));
  alloc_ext(in_stack_00000020,(CVmNetFile *)flags,in_stack_00000014,in_stack_00000008,unaff_retaddr,
            mode_00,(int)siz,(int)ptr);
  return;
}

Assistant:

void CVmObjFile::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* read our character set */
    vm_obj_id_t charset = vmb_get_objid(ptr);
    ptr += VMB_OBJECT_ID;

    /* get the mode and access values */
    int mode = (unsigned char)*ptr++;
    int access = (unsigned char)*ptr++;

    /* get the flags */
    unsigned long flags = t3rp4u(ptr);

    /* 
     *   add in the out-of-sync flag, since we've restored the state from a
     *   past state and thus we're out of sync with the external file system
     *   environment 
     */
    flags |= VMOBJFILE_OUT_OF_SYNC;

    /* 
     *   Initialize our extension - we have no underlying network file
     *   descriptor or native file handle, since the file is out of sync by
     *   virtue of being loaded from a previously saved image state.  Note
     *   that we don't need a read buffer because the file is inherently out
     *   of sync and thus cannot be read.  
     */
    alloc_ext(vmg_ 0, charset, 0, flags, mode, access, FALSE);
}